

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

bool GetVarAddrType(AActor *self,FName *varname,int index,void **addr,PType **type,bool readonly)

{
  PType *pPVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  DObject *p;
  PField *pPVar5;
  PArray *pPVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PClass *pPVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  void *pvVar8;
  bool bVar9;
  FName local_34;
  
  if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
    (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
  }
  p = (DObject *)
      PSymbolTable::FindSymbol
                (&(((self->super_DThinker).super_DObject.Class)->super_PNativeStruct).super_PStruct.
                  super_PNamedType.super_PCompoundType.super_PType.Symbols,&local_34,true);
  pPVar5 = dyn_cast<PField>(p);
  if ((pPVar5 != (PField *)0x0) && ((readonly || ((pPVar5->Flags & 8) == 0)))) {
    pPVar1 = pPVar5->Type;
    *type = pPVar1;
    pvVar8 = (void *)((long)&(self->super_DThinker).super_DObject._vptr_DObject + pPVar5->Offset);
    pPVar6 = dyn_cast<PArray>((DObject *)pPVar1);
    if (pPVar6 == (PArray *)0x0) {
      if (index != 0) {
        return false;
      }
    }
    else {
      *type = pPVar6->ElementType;
      if (pPVar6->ElementCount <= (uint)index) {
        return false;
      }
      pvVar8 = (void *)((long)pvVar8 + (ulong)(index * pPVar6->ElementSize));
    }
    *addr = pvVar8;
    pPVar7 = PInt::RegistrationInfo.MyClass;
    pPVar1 = *type;
    if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
      (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
    }
    pPVar2 = PFloat::RegistrationInfo.MyClass;
    if ((pPVar1->super_PTypeBase).super_DObject.Class == pPVar7) {
      return true;
    }
    pPVar1 = *type;
    if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
      (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar4);
    }
    pPVar3 = PName::RegistrationInfo.MyClass;
    pPVar7 = (pPVar1->super_PTypeBase).super_DObject.Class;
    bVar9 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar2 && bVar9) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar2) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (bVar9) {
      return true;
    }
    if (readonly) {
      pPVar1 = *type;
      if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
        (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar4);
      }
      pPVar7 = PString::RegistrationInfo.MyClass;
      if ((pPVar1->super_PTypeBase).super_DObject.Class == pPVar3) {
        return true;
      }
      pPVar1 = *type;
      if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
        (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_03,iVar4);
      }
      if ((pPVar1->super_PTypeBase).super_DObject.Class == pPVar7) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GetVarAddrType(AActor *self, FName varname, int index, void *&addr, PType *&type, bool readonly)
{
	PField *var = dyn_cast<PField>(self->GetClass()->Symbols.FindSymbol(varname, true));
	PArray *arraytype;

	if (var == NULL || (!readonly && (var->Flags & VARF_Native)))
	{
		return false;
	}
	type = var->Type;
	BYTE *baddr = reinterpret_cast<BYTE *>(self) + var->Offset;
	arraytype = dyn_cast<PArray>(type);
	if (arraytype != NULL)
	{
		// unwrap contained type
		type = arraytype->ElementType;
		// offset by index (if in bounds)
		if ((unsigned)index >= arraytype->ElementCount)
		{ // out of bounds
			return false;
		}
		baddr += arraytype->ElementSize * index;
	}
	else if (index != 0)
	{ // ignore attempts to set indexed values on non-arrays
		return false;
	}
	addr = baddr;
	// We don't want Int subclasses like Name or Color to be accessible,
	// but we do want to support Float subclasses like Fixed.
	if (!type->IsA(RUNTIME_CLASS(PInt)) && !type->IsKindOf(RUNTIME_CLASS(PFloat)))
	{
		// For reading, we also support Name and String types.
		if (readonly && (type->IsA(RUNTIME_CLASS(PName)) || type->IsA(RUNTIME_CLASS(PString))))
		{
			return true;
		}
		return false;
	}
	return true;
}